

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  bool bVar1;
  int iVar2;
  uint fAiger;
  uint fUseOldMin;
  uint fVerbose;
  uint fMinimize;
  uint fCheckCex;
  uint fHighEffort;
  uint fUseSatBased;
  FILE *pFVar3;
  Abc_Cex_t *pAVar4;
  Abc_Obj_t *pObj;
  char *pcVar5;
  Vec_Ptr_t *p;
  long lVar6;
  uint i;
  char *pcVar7;
  uint fNames;
  size_t sStack_90;
  uint local_80;
  uint local_7c;
  
  fUseSatBased = 0;
  Extra_UtilGetoptReset();
  fHighEffort = 0;
  fUseOldMin = 0;
  fCheckCex = 0;
  bVar1 = false;
  fAiger = 0;
  local_80 = 0;
  local_7c = 0;
  fVerbose = 0;
  fMinimize = 0;
  fNames = 0;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"snmueocafzvh");
    switch(iVar2) {
    case 0x61:
      fAiger = fAiger ^ 1;
      break;
    case 0x62:
    case 100:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x77:
    case 0x78:
    case 0x79:
switchD_002d37ac_caseD_62:
      fwrite("usage: write_cex [-snmueocfzvh] <file>\n",0x27,1,(FILE *)pAbc->Err);
      fwrite("\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n"
             ,0x50,1,(FILE *)pAbc->Err);
      fwrite("\t         the output file <file> contains values for each PI in natural order\n",0x4e
             ,1,(FILE *)pAbc->Err);
      pcVar5 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n",pcVar7
             );
      pcVar7 = "yes";
      if (fNames == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-n     : write input names into the file [default = %s]\n",pcVar7
             );
      pcVar7 = "yes";
      if (fMinimize == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-m     : minimize CEX by dropping don\'t-care values [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (fUseSatBased == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-u     : use fast SAT-based CEX minimization [default = %s]\n",
              pcVar7);
      pcVar7 = "yes";
      if (fHighEffort == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (fUseOldMin == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-o     : use old CEX minimization algorithm [default = %s]\n",
              pcVar7);
      pcVar7 = "yes";
      if (fCheckCex == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-c     : check generated CEX using ternary simulation [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (fAiger == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-a     : print cex in AIGER 1.9 format [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_80 == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-f     : enable printing flop values in each timeframe [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_7c == 0) {
        pcVar7 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-z     : toggle using saved flop names [default = %s]\n",pcVar7);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v     : enable verbose output [default = %s]\n",pcVar5);
      fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
      fwrite("\t<file> : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
      return 1;
    case 99:
      fCheckCex = fCheckCex ^ 1;
      break;
    case 0x65:
      fHighEffort = fHighEffort ^ 1;
      break;
    case 0x66:
      local_80 = local_80 ^ 1;
      break;
    case 0x6d:
      fMinimize = fMinimize ^ 1;
      break;
    case 0x6e:
      fNames = fNames ^ 1;
      break;
    case 0x6f:
      fUseOldMin = fUseOldMin ^ 1;
      break;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x75:
      fUseSatBased = fUseSatBased ^ 1;
      break;
    case 0x76:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x7a:
      local_7c = local_7c ^ 1;
      break;
    default:
      if (iVar2 != -1) goto switchD_002d37ac_caseD_62;
      pNtk = pAbc->pNtkCur;
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pFVar3 = (FILE *)pAbc->Out;
        pcVar7 = "Empty network.\n";
        sStack_90 = 0xf;
      }
      else {
        if (((pNtk->pModel != (int *)0x0) || (pAbc->pCex != (Abc_Cex_t *)0x0)) ||
           (pAbc->vCexVec != (Vec_Ptr_t *)0x0)) {
          if (globalUtilOptind + 1 == argc) {
            pcVar7 = argv[globalUtilOptind];
            pAVar4 = pAbc->pCex;
            if ((pAVar4 == (Abc_Cex_t *)0x0) && (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
              pFVar3 = fopen(pcVar7,"w");
              if (pFVar3 == (FILE *)0x0) {
LAB_002d3c9e:
                fprintf(_stdout,"IoCommandWriteCex(): Cannot open the output file \"%s\".\n",pcVar7)
                ;
                return 1;
              }
              if (fNames == 0) {
                for (lVar6 = 0; lVar6 < pNtk->vPis->nSize; lVar6 = lVar6 + 1) {
                  Abc_NtkPi(pNtk,(int)lVar6);
                  fputc(pNtk->pModel[lVar6] == 1 | 0x30,pFVar3);
                }
              }
              else {
                pcVar7 = "@0";
                if (!bVar1) {
                  pcVar7 = "";
                }
                for (lVar6 = 0; lVar6 < pNtk->vPis->nSize; lVar6 = lVar6 + 1) {
                  pObj = Abc_NtkPi(pNtk,(int)lVar6);
                  pcVar5 = Abc_ObjName(pObj);
                  fprintf(pFVar3,"%s%s=%c\n",pcVar5,pcVar7,(ulong)(pNtk->pModel[lVar6] == 1 | 0x30))
                  ;
                }
              }
              fputc(10,pFVar3);
            }
            else {
              pFVar3 = fopen(pcVar7,"w");
              if (pFVar3 == (FILE *)0x0) goto LAB_002d3c9e;
              if (pAbc->pCex == (Abc_Cex_t *)0x0) {
                p = pAbc->vCexVec;
                if (p != (Vec_Ptr_t *)0x0) {
                  for (i = 0; (int)i < p->nSize; i = i + 1) {
                    pAVar4 = (Abc_Cex_t *)Vec_PtrEntry(p,i);
                    if (pAVar4 != (Abc_Cex_t *)0x0) {
                      fprintf(pFVar3,"#\n#\n# CEX for output %d\n#\n",(ulong)i);
                      Abc_NtkDumpOneCex((FILE *)pFVar3,pNtk,pAVar4,local_80,fNames,local_7c,
                                        fMinimize,fUseOldMin,fCheckCex,fUseSatBased,fHighEffort,
                                        fAiger,fVerbose);
                    }
                    p = pAbc->vCexVec;
                  }
                }
              }
              else {
                Abc_NtkDumpOneCex((FILE *)pFVar3,pNtk,pAVar4,local_80,fNames,local_7c,fMinimize,
                                  fUseOldMin,fCheckCex,fUseSatBased,fHighEffort,fAiger,fVerbose);
              }
              fwrite("# DONE\n",7,1,pFVar3);
            }
            fclose(pFVar3);
            return 0;
          }
          puts("File name is missing on the command line.");
          goto switchD_002d37ac_caseD_62;
        }
        pFVar3 = (FILE *)pAbc->Out;
        pcVar7 = "Counter-example is not available.\n";
        sStack_90 = 0x22;
      }
      fwrite(pcVar7,sStack_90,1,pFVar3);
      return 0;
    }
  } while( true );
}

Assistant:

int IoCommandWriteCex( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fNames  = 0;
    int fMinimize  = 0;
    int fUseSatBased = 0;
    int fHighEffort = 0;
    int fUseOldMin = 0;
    int fCheckCex  = 0;
    int forceSeq   = 0;
    int fAiger     = 0;
    int fPrintFull = 0;
    int fUseFfNames = 0;
    int fVerbose   = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "snmueocafzvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 's':
                forceSeq ^= 1;
                break;
            case 'n':
                fNames ^= 1;
                break;
            case 'm':
                fMinimize ^= 1;
                break;
            case 'u':
                fUseSatBased ^= 1;
                break;
            case 'e':
                fHighEffort ^= 1;
                break;
            case 'o':
                fUseOldMin ^= 1;
                break;
            case 'c':
                fCheckCex ^= 1;
                break;
            case 'a':
                fAiger ^= 1;
                break;
            case 'f':
                fPrintFull ^= 1;
                break;
            case 'z':
                fUseFfNames ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    pNtk = pAbc->pNtkCur;
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( pNtk->pModel == NULL && pAbc->pCex == NULL && pAbc->vCexVec == NULL )
    {
        fprintf( pAbc->Out, "Counter-example is not available.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "File name is missing on the command line.\n" );
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    // write the counter-example into the file
    if ( pAbc->pCex || pAbc->vCexVec )
    { 
        Abc_Cex_t * pCex = pAbc->pCex;
        FILE * pFile; int i;
        /*
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( !Abc_LatchIsInit0(pObj) )
            {
                fprintf( stdout, "IoCommandWriteCex(): The init-state should be all-0 for counter-example to work.\n" );
                fprintf( stdout, "Run commands \"undc\" and \"zero\" and then rerun the equivalence check.\n" );
                return 1;
            }
        */
        pFile = fopen( pFileName, "w" );
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( pAbc->pCex )
        {
            Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
        }
        else if ( pAbc->vCexVec )
        {
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pCex, i )
            {
                if ( pCex == NULL )
                    continue;
                fprintf( pFile, "#\n#\n# CEX for output %d\n#\n", i ); 
                Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                    fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                    fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
            }
        }
        fprintf( pFile, "# DONE\n" ); 
        fclose( pFile );
    }
    else
    {
        Abc_Obj_t * pObj;
        FILE * pFile = fopen( pFileName, "w" );
        int i;
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( fNames )
        {
            const char *cycle_ctr = forceSeq?"@0":"";
            Abc_NtkForEachPi( pNtk, pObj, i )
//                fprintf( pFile, "%s=%c\n", Abc_ObjName(pObj), '0'+(pNtk->pModel[i]==1) );
                fprintf( pFile, "%s%s=%c\n", Abc_ObjName(pObj), cycle_ctr, '0'+(pNtk->pModel[i]==1) );
        }
        else
        {
            Abc_NtkForEachPi( pNtk, pObj, i )
                fprintf( pFile, "%c", '0'+(pNtk->pModel[i]==1) );
        }
        fprintf( pFile, "\n" );
        fclose( pFile );
    }

    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cex [-snmueocfzvh] <file>\n" );
    fprintf( pAbc->Err, "\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n" );
    fprintf( pAbc->Err, "\t         the output file <file> contains values for each PI in natural order\n" );
    fprintf( pAbc->Err, "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n", forceSeq? "yes": "no" );
    fprintf( pAbc->Err, "\t-n     : write input names into the file [default = %s]\n", fNames? "yes": "no" );
    fprintf( pAbc->Err, "\t-m     : minimize CEX by dropping don't-care values [default = %s]\n", fMinimize? "yes": "no" );
    fprintf( pAbc->Err, "\t-u     : use fast SAT-based CEX minimization [default = %s]\n", fUseSatBased? "yes": "no" );
    fprintf( pAbc->Err, "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n", fHighEffort? "yes": "no" );
    fprintf( pAbc->Err, "\t-o     : use old CEX minimization algorithm [default = %s]\n", fUseOldMin? "yes": "no" );
    fprintf( pAbc->Err, "\t-c     : check generated CEX using ternary simulation [default = %s]\n", fCheckCex? "yes": "no" );
    fprintf( pAbc->Err, "\t-a     : print cex in AIGER 1.9 format [default = %s]\n", fAiger? "yes": "no" );
    fprintf( pAbc->Err, "\t-f     : enable printing flop values in each timeframe [default = %s]\n", fPrintFull? "yes": "no" );  
    fprintf( pAbc->Err, "\t-z     : toggle using saved flop names [default = %s]\n", fUseFfNames? "yes": "no" );  
    fprintf( pAbc->Err, "\t-v     : enable verbose output [default = %s]\n", fVerbose? "yes": "no" );  
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\t<file> : the name of the file to write\n" );
    return 1;
}